

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

int __thiscall QHexView::copy(QHexView *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QHexDocument *pQVar1;
  qsizetype qVar2;
  bool bVar3;
  int extraout_EAX;
  void *__buf;
  QString local_90;
  QByteArray local_68;
  QByteArray local_50;
  undefined1 local_38 [8];
  QByteArray bytes;
  QClipboard *c;
  bool hex_local;
  QHexView *this_local;
  
  QCoreApplication::instance();
  bytes.d.size = QGuiApplication::clipboard();
  bVar3 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar3) {
    QHexCursor::selectedBytes((QByteArray *)local_38,this->m_hexcursor);
  }
  else {
    pQVar1 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_38,(int)pQVar1,__buf,1);
  }
  if (((ulong)dst & 1) != 0) {
    QHexUtils::toHex(&local_68,(QByteArray *)local_38,' ');
    QByteArray::toUpper(&local_50,&local_68);
    QByteArray::operator=((QByteArray *)local_38,&local_50);
    QByteArray::~QByteArray(&local_50);
    QByteArray::~QByteArray(&local_68);
  }
  qVar2 = bytes.d.size;
  QString::QString(&local_90,(QByteArray *)local_38);
  QClipboard::setText(qVar2,&local_90,0);
  QString::~QString(&local_90);
  QByteArray::~QByteArray((QByteArray *)local_38);
  return extraout_EAX;
}

Assistant:

void QHexView::copy(bool hex) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    if(hex)
        bytes = QHexUtils::toHex(bytes, ' ').toUpper();
    c->setText(bytes);
}